

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_io.c
# Opt level: O0

void voutlet_dsp(t_voutlet *x,t_signal **sp)

{
  t_signal *ptVar1;
  t_signal *insig;
  t_signal **sp_local;
  t_voutlet *x_local;
  
  if (x->x_buf != (t_sample *)0x0) {
    ptVar1 = *sp;
    if (x->x_justcopyout == '\0') {
      if (x->x_directsignal == (t_signal *)0x0) {
        dsp_add(voutlet_perform,3,x,ptVar1->s_vec,(long)ptVar1->s_n);
      }
      else {
        signal_setborrowed(x->x_directsignal,*sp);
      }
    }
    else {
      dsp_add_copy(ptVar1->s_vec,x->x_directsignal->s_vec,ptVar1->s_n);
    }
  }
  return;
}

Assistant:

static void voutlet_dsp(t_voutlet *x, t_signal **sp)
{
    t_signal *insig;
    if (!x->x_buf) return;
    insig = sp[0];
    if (x->x_justcopyout)
        dsp_add_copy(insig->s_vec, x->x_directsignal->s_vec, insig->s_n);
    else if (x->x_directsignal)
    {
            /* if we're just going to make the signal available on the
            parent patch, hand it off to the parent signal. */
        /* this is done elsewhere--> sp[0]->s_refcount++; */
        signal_setborrowed(x->x_directsignal, sp[0]);
    }
    else
        dsp_add(voutlet_perform, 3, x, insig->s_vec, (t_int)insig->s_n);
}